

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::session_handle::async_add_torrent(session_handle *this,add_torrent_params *params)

{
  uint uVar1;
  bool bVar2;
  anon_class_8_1_54a39810_for_m_fun f;
  char *in_RCX;
  undefined1 auVar3 [16];
  string_view f_00;
  string local_68;
  add_torrent_params *local_48;
  undefined1 local_40 [8];
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_handle_cpp:429:31)>
  guard;
  add_torrent_params *p;
  add_torrent_params *local_18;
  add_torrent_params *params_local;
  session_handle *this_local;
  
  local_18 = params;
  params_local = (add_torrent_params *)this;
  bVar2 = info_hash_t::has_v1(&params->info_hashes);
  if (((!bVar2) && (bVar2 = info_hash_t::has_v2(&local_18->info_hashes), !bVar2)) &&
     (bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->ti), !bVar2)) {
    *(undefined8 *)(local_18->info_hashes).v1.m_number._M_elems =
         *(undefined8 *)(local_18->info_hash).m_number._M_elems;
    *(undefined8 *)((local_18->info_hashes).v1.m_number._M_elems + 2) =
         *(undefined8 *)((local_18->info_hash).m_number._M_elems + 2);
    uVar1 = (local_18->info_hash).m_number._M_elems[4];
    in_RCX = (char *)(ulong)uVar1;
    (local_18->info_hashes).v1.m_number._M_elems[4] = uVar1;
  }
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->ti);
  if (bVar2) {
    ::std::__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&local_18->ti);
    ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>((torrent_info *)&p);
    ::std::shared_ptr<libtorrent::torrent_info>::operator=
              (&local_18->ti,(shared_ptr<libtorrent::torrent_info> *)&p);
    ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr
              ((shared_ptr<libtorrent::torrent_info> *)&p);
  }
  f.p = (add_torrent_params *)operator_new(0x350);
  add_torrent_params::add_torrent_params(f.p,local_18);
  local_48 = f.p;
  guard._8_8_ = f.p;
  libtorrent::aux::
  scope_end<libtorrent::session_handle::async_add_torrent(libtorrent::add_torrent_params&&)::__0>
            ((aux *)local_40,f);
  auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                     ((string *)(guard._8_8_ + 0x80));
  f_00._M_len = auVar3._8_8_;
  f_00._M_str = in_RCX;
  complete_abi_cxx11_(&local_68,auVar3._0_8_,f_00);
  ::std::__cxx11::string::operator=((string *)(guard._8_8_ + 0x80),(string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_68);
  async_call<void(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params*),libtorrent::add_torrent_params*&>
            (this,0x599d00,(add_torrent_params **)0x0);
  libtorrent::aux::
  scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_handle.cpp:429:31)>
  ::disarm((scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_handle_cpp:429:31)>
            *)local_40);
  libtorrent::aux::
  scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_handle.cpp:429:31)>
  ::~scope_end_impl((scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_handle_cpp:429:31)>
                     *)local_40);
  return;
}

Assistant:

void session_handle::async_add_torrent(add_torrent_params&& params)
	{
		TORRENT_ASSERT_PRECOND(!params.save_path.empty());

#if TORRENT_ABI_VERSION < 3
		if (!params.info_hashes.has_v1() && !params.info_hashes.has_v2() && !params.ti)
			params.info_hashes.v1 = params.info_hash;
#endif

		// the internal torrent object keeps and mutates state in the
		// torrent_info object. We can't let that leak back to the client
		if (params.ti)
			params.ti = std::make_shared<torrent_info>(*params.ti);

		// we cannot capture a unique_ptr into a lambda in c++11, so we use a raw
		// pointer for now. async_call uses a lambda expression to post the call
		// to the main thread
		// TODO: in C++14, use unique_ptr and move it into the lambda
		auto* p = new add_torrent_params(std::move(params));
		auto guard = aux::scope_end([p]{ delete p; });
		p->save_path = complete(p->save_path);

#if TORRENT_ABI_VERSION == 1
		handle_backwards_compatible_resume_data(*p);
#endif

		async_call(&session_impl::async_add_torrent, p);
		guard.disarm();
	}